

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ZlibContext * __thiscall
kj::Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::
emplace<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode,kj::CompressionParameters&>
          (Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *this,Mode *params,
          CompressionParameters *params_1)

{
  Mode *params_00;
  CompressionParameters *params_1_00;
  ZlibContext *pZVar1;
  CompressionParameters *params_local_1;
  Mode *params_local;
  Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *this_local;
  
  params_00 = fwd<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode>(params);
  params_1_00 = fwd<kj::CompressionParameters&>(params_1);
  pZVar1 = kj::_::NullableValue<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::
           emplace<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode,kj::CompressionParameters&>
                     (&this->ptr,params_00,params_1_00);
  return pZVar1;
}

Assistant:

inline T& emplace(Params&&... params) {
    // Replace this Maybe's content with a new value constructed by passing the given parameters to
    // T's constructor. This can be used to initialize a Maybe without copying or even moving a T.
    // Returns a reference to the newly-constructed value.

    return ptr.emplace(kj::fwd<Params>(params)...);
  }